

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O0

string * __thiscall
cmTimestamp::AddTimestampComponent_abi_cxx11_
          (string *__return_storage_ptr__,cmTimestamp *this,char flag,tm *timeStruct,time_t timeT,
          bool utcFlag,uint32_t microseconds)

{
  double dVar1;
  long lVar2;
  char *__format;
  size_t sVar3;
  allocator local_1a1;
  size_t local_1a0;
  size_t size;
  char buffer [16];
  allocator<char> local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  string microsecs;
  string local_130;
  time_t local_100;
  time_t unixEpoch;
  tm tmUnixEpoch;
  cmAlphaNum local_b8;
  cmAlphaNum local_88;
  undefined1 local_58 [8];
  string formatString;
  bool utcFlag_local;
  time_t timeT_local;
  tm *timeStruct_local;
  char flag_local;
  cmTimestamp *this_local;
  
  formatString.field_2._M_local_buf[0xf] = utcFlag;
  cmAlphaNum::cmAlphaNum(&local_88,'%');
  cmAlphaNum::cmAlphaNum(&local_b8,flag);
  cmStrCat<>((string *)local_58,&local_88,&local_b8);
  switch(flag) {
  case '%':
  case 'A':
  case 'B':
  case 'H':
  case 'I':
  case 'M':
  case 'S':
  case 'U':
  case 'V':
  case 'Y':
  case 'a':
  case 'b':
  case 'd':
  case 'j':
  case 'm':
  case 'w':
  case 'y':
    break;
  default:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_58);
    microsecs.field_2._8_4_ = 1;
    goto LAB_0037b4f3;
  case 'Z':
    break;
  case 'f':
    std::__cxx11::to_string((string *)local_158,microseconds % 1000000);
    lVar2 = std::__cxx11::string::length();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,6 - lVar2,'0',&local_179);
    std::operator+(__return_storage_ptr__,&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    microsecs.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_158);
    goto LAB_0037b4f3;
  case 's':
    tmUnixEpoch.tm_wday = 0;
    tmUnixEpoch.tm_yday = 0;
    tmUnixEpoch.tm_isdst = 0;
    tmUnixEpoch._36_4_ = 0;
    tmUnixEpoch.tm_mon = 0;
    tmUnixEpoch.tm_year = 0;
    unixEpoch = 0;
    tmUnixEpoch.tm_gmtoff = 0;
    tmUnixEpoch.tm_sec = 0;
    tmUnixEpoch.tm_min = 1;
    tmUnixEpoch.tm_hour = 0;
    tmUnixEpoch.tm_mday = 0x46;
    local_100 = CreateUtcTimeTFromTm(this,(tm *)&unixEpoch);
    if (local_100 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,
                 "Error generating UNIX epoch in string(TIMESTAMP ...) or file(TIMESTAMP ...). Please, file a bug report against CMake"
                 ,(allocator<char> *)(microsecs.field_2._M_local_buf + 0xf));
      cmSystemTools::Error(&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator((allocator<char> *)(microsecs.field_2._M_local_buf + 0xf));
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      microsecs.field_2._8_4_ = 1;
    }
    else {
      dVar1 = difftime(timeT,local_100);
      std::__cxx11::to_string(__return_storage_ptr__,(long)dVar1);
      microsecs.field_2._8_4_ = 1;
    }
    goto LAB_0037b4f3;
  case 'z':
  }
  __format = (char *)std::__cxx11::string::c_str();
  sVar3 = strftime((char *)&size,0x10,__format,(tm *)timeStruct);
  local_1a0 = sVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)&size,sVar3,&local_1a1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  microsecs.field_2._8_4_ = 1;
LAB_0037b4f3:
  std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::AddTimestampComponent(
  char flag, struct tm& timeStruct, const time_t timeT, const bool utcFlag,
  const uint32_t microseconds) const
{
  std::string formatString = cmStrCat('%', flag);

  switch (flag) {
    case 'a':
    case 'A':
    case 'b':
    case 'B':
    case 'd':
    case 'H':
    case 'I':
    case 'j':
    case 'm':
    case 'M':
    case 'S':
    case 'U':
    case 'V':
    case 'w':
    case 'y':
    case 'Y':
    case '%':
      break;
    case 'Z':
#if defined(__GLIBC__)
      // 'struct tm' has the time zone, so strftime can honor UTC.
      static_cast<void>(utcFlag);
#else
      // 'struct tm' may not have the time zone, so strftime may
      // use local time.  Hard-code the UTC result.
      if (utcFlag) {
        return std::string("GMT");
      }
#endif
      break;
    case 'z': {
#if defined(__GLIBC__)
      // 'struct tm' has the time zone, so strftime can honor UTC.
      static_cast<void>(utcFlag);
#else
      // 'struct tm' may not have the time zone, so strftime may
      // use local time.  Hard-code the UTC result.
      if (utcFlag) {
        return std::string("+0000");
      }
#endif
#ifndef _AIX
      break;
#else
      std::string xpg_sus_old;
      bool const xpg_sus_was_set =
        cmSystemTools::GetEnv("XPG_SUS_ENV", xpg_sus_old);
      if (xpg_sus_was_set && xpg_sus_old == "ON") {
        break;
      }
      xpg_sus_old = "XPG_SUS_ENV=" + xpg_sus_old;

      // On AIX systems, %z requires XPG_SUS_ENV=ON to work as desired.
      cmSystemTools::PutEnv("XPG_SUS_ENV=ON");
      tzset();

      char buffer[16];
      size_t size = strftime(buffer, sizeof(buffer), "%z", &timeStruct);

#  ifndef CMAKE_BOOTSTRAP
      if (xpg_sus_was_set) {
        cmSystemTools::PutEnv(xpg_sus_old);
      } else {
        cmSystemTools::UnsetEnv("XPG_SUS_ENV");
      }
#  else
      // No UnsetEnv during bootstrap.  This is good enough for CMake itself.
      cmSystemTools::PutEnv(xpg_sus_old);
      static_cast<void>(xpg_sus_was_set);
#  endif
      tzset();

      return std::string(buffer, size);
#endif
    }
    case 's': // Seconds since UNIX epoch (midnight 1-jan-1970)
    {
      // Build a time_t for UNIX epoch and subtract from the input "timeT":
      struct tm tmUnixEpoch;
      memset(&tmUnixEpoch, 0, sizeof(tmUnixEpoch));
      tmUnixEpoch.tm_mday = 1;
      tmUnixEpoch.tm_year = 1970 - 1900;

      const time_t unixEpoch = this->CreateUtcTimeTFromTm(tmUnixEpoch);
      if (unixEpoch == -1) {
        cmSystemTools::Error(
          "Error generating UNIX epoch in string(TIMESTAMP ...) or "
          "file(TIMESTAMP ...). Please, file a bug report against CMake");
        return std::string();
      }

      return std::to_string(static_cast<long int>(difftime(timeT, unixEpoch)));
    }
    case 'f': // microseconds
    {
      // clip number to 6 digits and pad with leading zeros
      std::string microsecs = std::to_string(microseconds % 1000000);
      return std::string(6 - microsecs.length(), '0') + microsecs;
    }
    default: {
      return formatString;
    }
  }

  char buffer[16];

#ifdef __MINGW32__
  /* See a bug in MinGW: https://sourceforge.net/p/mingw-w64/bugs/793/. A work
   * around is to try to use strftime() from ucrtbase.dll. */
  using T = size_t(__cdecl*)(char*, size_t, const char*, const struct tm*);
  auto loadUcrtStrftime = []() -> T {
    auto handle =
      LoadLibraryExA("ucrtbase.dll", nullptr, LOAD_LIBRARY_SEARCH_SYSTEM32);
    if (handle) {
#  pragma GCC diagnostic push
#  pragma GCC diagnostic ignored "-Wcast-function-type"
      return reinterpret_cast<T>(GetProcAddress(handle, "strftime"));
#  pragma GCC diagnostic pop
    }
    return nullptr;
  };
  static T ucrtStrftime = loadUcrtStrftime();

  if (ucrtStrftime) {
    size_t size =
      ucrtStrftime(buffer, sizeof(buffer), formatString.c_str(), &timeStruct);
    return std::string(buffer, size);
  }
#endif

  size_t size =
    strftime(buffer, sizeof(buffer), formatString.c_str(), &timeStruct);

  return std::string(buffer, size);
}